

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

handle_model_result *
common_params_handle_model
          (handle_model_result *__return_storage_ptr__,common_params_model *model,
          string *bearer_token,string *model_path_default)

{
  string *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  handle_model_result *extraout_RAX;
  pointer psVar9;
  long *plVar10;
  undefined8 *puVar11;
  handle_model_result *extraout_RAX_00;
  long lVar12;
  long lVar13;
  handle_model_result *phVar14;
  size_t sVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  _Result<bool> *this;
  handle_model_result *extraout_RAX_01;
  common_log *pcVar17;
  invalid_argument *this_00;
  runtime_error *prVar18;
  element_type *peVar19;
  ulong *puVar20;
  pointer ppVar21;
  pointer pbVar22;
  pointer pbVar23;
  pointer pbVar24;
  _State_baseV2 *__tmp;
  pointer pbVar25;
  char *fmt;
  uint uVar26;
  uint uVar27;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar28;
  string ggufFile;
  curl_slist_ptr http_headers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string mmprojFile;
  string url;
  string model_endpoint_1;
  smatch match;
  long res_code;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string hf_repo;
  string res_str;
  string tag;
  string model_endpoint;
  common_params_model *local_31e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31d8;
  curl_slist_ptr local_31b8;
  string local_31b0;
  __basic_future<bool> local_3190;
  undefined1 local_3180 [24];
  undefined1 local_3168 [24];
  long lStack_3150;
  handle_model_result *local_3140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3138;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_30f8;
  undefined1 *local_30d8;
  undefined8 local_30d0;
  undefined1 local_30c8;
  undefined7 uStack_30c7;
  long local_30b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30b0;
  undefined1 local_3098 [2096];
  undefined1 local_2868 [2096];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [32];
  char *local_1018;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1010;
  char *local_ff8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ff0 [252];
  
  __return_storage_ptr__->found_mmproj = false;
  local_3180._16_8_ = bearer_token;
  local_3140 = __return_storage_ptr__;
  common_params_model::common_params_model(&__return_storage_ptr__->mmproj);
  if ((model->hf_repo)._M_string_length == 0) {
    phVar14 = (handle_model_result *)(model->path)._M_string_length;
    if ((model->url)._M_string_length == 0) {
      if (phVar14 == (handle_model_result *)0x0) {
        phVar14 = (handle_model_result *)std::__cxx11::string::_M_assign((string *)model);
      }
    }
    else if (phVar14 == (handle_model_result *)0x0) {
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2038,&model->url,'#');
      local_1038._0_8_ = (handle_model_result *)(local_1038 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1038,*(long *)local_2038._0_8_,
                 *(size_type *)(local_2038._0_8_ + 8) + *(long *)local_2038._0_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2038);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2038,(string *)local_1038,'?');
      std::__cxx11::string::_M_assign((string *)local_1038);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2038);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3098,(string *)local_1038,'/');
      fs_get_cache_file((string *)local_2038,(string *)(local_3098._8_8_ + -0x20));
      std::__cxx11::string::operator=((string *)model,(string *)local_2038);
      if ((pointer)local_2038._0_8_ != (pointer)(local_2038 + 0x10)) {
        operator_delete((void *)local_2038._0_8_,(ulong)(local_2038._16_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3098);
      phVar14 = extraout_RAX;
      if ((handle_model_result *)local_1038._0_8_ != (handle_model_result *)(local_1038 + 0x10))
      goto LAB_0015b0f3;
    }
  }
  else {
    psVar1 = &model->hf_repo;
    if ((model->hf_file)._M_string_length == 0) {
      if ((model->path)._M_string_length == 0) {
        string_split<std::__cxx11::string>(&local_30b0,psVar1,':');
        if ((ulong)((long)local_30b0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_30b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          local_2038._0_8_ = local_2038 + 0x10;
          local_2038._8_8_ = (pointer)0x6;
          local_2038._16_7_ = 0x74736574616c;
        }
        else {
          local_2038._0_8_ = local_2038 + 0x10;
          pcVar2 = local_30b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2038,pcVar2,
                     pcVar2 + local_30b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length);
        }
        local_3098._0_8_ = local_3098 + 0x10;
        pcVar2 = ((local_30b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3098,pcVar2,
                   pcVar2 + (local_30b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        string_split<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2868,(string *)local_3098,'/');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2868);
        if (local_2868._8_8_ - local_2868._0_8_ != 0x40) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"error: invalid HF repo format, expected <user>/<model>[:quant]\n");
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        lVar12 = curl_easy_init();
        local_31b8.ptr = (curl_slist *)0x0;
        local_2868._0_8_ = local_2868 + 0x10;
        local_2868._8_8_ = (pointer)0x0;
        local_2868._16_8_ = local_2868._16_8_ & 0xffffffffffffff00;
        get_model_endpoint_abi_cxx11_();
        local_31b0._M_dataplus._M_p = (pointer)&local_31b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_31b0,local_3138.first._M_dataplus._M_p,
                   local_3138.first._M_dataplus._M_p +
                   (long)(_func_int ***)local_3138.first._M_string_length);
        std::__cxx11::string::append((char *)&local_31b0);
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_31b0,local_3098._0_8_);
        peVar19 = (element_type *)(plVar10 + 2);
        if ((element_type *)*plVar10 == peVar19) {
          local_3180._0_8_ = peVar19->_vptr__State_baseV2;
          local_3180._8_8_ = plVar10[3];
          local_3190._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_3180;
        }
        else {
          local_3180._0_8_ = peVar19->_vptr__State_baseV2;
          local_3190._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar10;
        }
        local_3190._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[1];
        *plVar10 = (long)peVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_3190);
        local_31d8._M_dataplus._M_p = (pointer)&local_31d8.field_2;
        puVar20 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_31d8.field_2._M_allocated_capacity = *puVar20;
          local_31d8.field_2._8_8_ = plVar10[3];
        }
        else {
          local_31d8.field_2._M_allocated_capacity = *puVar20;
          local_31d8._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_31d8._M_string_length = plVar10[1];
        *plVar10 = (long)puVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_31d8,local_2038._0_8_);
        local_3168._0_8_ = local_3168 + 0x10;
        ppVar21 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == ppVar21) {
          local_3168._16_8_ = (ppVar21->first)._M_dataplus._M_p;
          lStack_3150 = plVar10[3];
        }
        else {
          local_3168._16_8_ = (ppVar21->first)._M_dataplus._M_p;
          local_3168._0_8_ = (pointer)*plVar10;
        }
        local_3168._8_8_ = plVar10[1];
        *plVar10 = (long)ppVar21;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_31d8._M_dataplus._M_p != &local_31d8.field_2) {
          operator_delete(local_31d8._M_dataplus._M_p,local_31d8.field_2._M_allocated_capacity + 1);
        }
        if (local_3190._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)local_3180) {
          operator_delete(local_3190._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_3180._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_31b0._M_dataplus._M_p != &local_31b0.field_2) {
          operator_delete(local_31b0._M_dataplus._M_p,local_31b0.field_2._M_allocated_capacity + 1);
        }
        curl_easy_setopt(lVar12,0x2712,local_3168._0_8_);
        curl_easy_setopt(lVar12,0x2b,1);
        curl_easy_setopt(lVar12,0x4e2b,common_get_hf_file::anon_class_1_0_00000001::__invoke);
        curl_easy_setopt(lVar12,0x2711,local_2868);
        if (*(size_type *)(local_3180._16_8_ + 8) != 0) {
          std::operator+(&local_31d8,"Authorization: Bearer ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3180._16_8_);
          local_31b8.ptr =
               (curl_slist *)curl_slist_append(local_31b8.ptr,local_31d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_31d8._M_dataplus._M_p != &local_31d8.field_2) {
            operator_delete(local_31d8._M_dataplus._M_p,local_31d8.field_2._M_allocated_capacity + 1
                           );
          }
        }
        local_31b8.ptr = (curl_slist *)curl_slist_append(local_31b8.ptr,"User-Agent: llama-cpp");
        local_31b8.ptr = (curl_slist *)curl_slist_append(local_31b8.ptr,"Accept: application/json");
        curl_easy_setopt(lVar12,0x2727,local_31b8.ptr);
        iVar8 = curl_easy_perform(lVar12);
        if (iVar8 != 0) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar18,"error: cannot make GET request to HF API");
          __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_31d8._M_dataplus._M_p = (pointer)&local_31d8.field_2;
        local_31d8._M_string_length = 0;
        local_31d8.field_2._M_allocated_capacity =
             local_31d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_3190._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_3180._0_8_ = local_3180._0_8_ & 0xffffffffffffff00;
        local_3190._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_3180;
        curl_easy_getinfo(lVar12,0x200002,&local_30b8);
        if (local_30b8 != 200) {
          if (local_30b8 != 0x191) {
            prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
            string_format_abi_cxx11_
                      (&local_31b0,"error from HF API, response code: %ld, data: %s",local_30b8,
                       local_2868._0_8_);
            std::runtime_error::runtime_error(prVar18,(string *)&local_31b0);
            __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar18,
                     "error: model is private or does not exist; if you are accessing a gated model, please provide a valid HF token"
                    );
LAB_0015b7d6:
          __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_31b0,
                   "\"ggufFile\"[\\s\\S]*?\"rfilename\"\\s*:\\s*\"([^\"]+)\"",0x10);
        local_30f8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_30f8._M_begin._M_current = (char *)0x0;
        local_30f8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_30f8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar6 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_2868._0_8_,
                           (char *)(local_2868._0_8_ + (long)(_Alloc_hider *)local_2868._8_8_),
                           &local_30f8,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_31b0,0);
        if (bVar6) {
          lVar13 = (long)local_30f8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_30f8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar13 == 0) || (0xfffffffffffffffd < (lVar13 >> 3) * -0x5555555555555555 - 5U)) {
            psVar9 = (pointer)((long)local_30f8.
                                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x48);
          }
          else {
            psVar9 = local_30f8.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          if (psVar9->matched == true) {
            local_30d8 = &local_30c8;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_30d8,
                       (psVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (psVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_30d8 = &local_30c8;
            local_30d0 = 0;
            local_30c8 = 0;
          }
          std::__cxx11::string::operator=((string *)&local_31d8,(string *)&local_30d8);
          if (local_30d8 != &local_30c8) {
            operator_delete(local_30d8,CONCAT71(uStack_30c7,local_30c8) + 1);
          }
        }
        if (local_30f8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_30f8.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_30f8.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_30f8.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_31b0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_31b0,
                   "\"mmprojFile\"[\\s\\S]*?\"rfilename\"\\s*:\\s*\"([^\"]+)\"",0x10);
        local_30f8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_30f8._M_begin._M_current = (char *)0x0;
        local_30f8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_30f8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar6 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_2868._0_8_,
                           (char *)(local_2868._0_8_ + (long)(_Alloc_hider *)local_2868._8_8_),
                           &local_30f8,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_31b0,0);
        if (bVar6) {
          lVar13 = (long)local_30f8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_30f8.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar13 == 0) || (0xfffffffffffffffd < (lVar13 >> 3) * -0x5555555555555555 - 5U)) {
            psVar9 = (pointer)((long)local_30f8.
                                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x48);
          }
          else {
            psVar9 = local_30f8.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          local_30d8 = &local_30c8;
          if (psVar9->matched == true) {
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_30d8,
                       (psVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (psVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_30d0 = 0;
            local_30c8 = 0;
          }
          std::__cxx11::string::operator=((string *)&local_3190,(string *)&local_30d8);
          if (local_30d8 != &local_30c8) {
            operator_delete(local_30d8,CONCAT71(uStack_30c7,local_30c8) + 1);
          }
        }
        if (local_30f8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_30f8.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_30f8.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_30f8.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_31b0);
        if (local_31d8._M_string_length == 0) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar18,"error: model does not have ggufFile");
          goto LAB_0015b7d6;
        }
        local_1038._0_8_ = local_1038 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1038,local_3098._0_8_,
                   (pointer)(local_3098._0_8_ + (long)(_Alloc_hider *)local_3098._8_8_));
        local_1018 = local_1010._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1018,local_31d8._M_dataplus._M_p,
                   local_31d8._M_dataplus._M_p + local_31d8._M_string_length);
        local_ff8 = local_ff0[0]._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_ff8,
                   local_3190._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(undefined1 *)
                           ((long)&(local_3190._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr__State_baseV2 +
                           (long)&(local_3190._M_state.
                                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_vptr__Sp_counted_base));
        if (local_3190._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)local_3180) {
          operator_delete(local_3190._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_3180._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_31d8._M_dataplus._M_p != &local_31d8.field_2) {
          operator_delete(local_31d8._M_dataplus._M_p,local_31d8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_3168._0_8_ != (pointer)(local_3168 + 0x10)) {
          operator_delete((void *)local_3168._0_8_,
                          (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_3168._16_8_)->_M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3138.first._M_dataplus._M_p != &local_3138.first.field_2) {
          operator_delete(local_3138.first._M_dataplus._M_p,
                          local_3138.first.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_2868._0_8_ != (pointer)(local_2868 + 0x10)) {
          operator_delete((void *)local_2868._0_8_,(ulong)(local_2868._16_8_ + 1));
        }
        curl_slist_ptr::~curl_slist_ptr(&local_31b8);
        if (lVar12 != 0) {
          curl_easy_cleanup(lVar12);
        }
        if ((pointer)local_3098._0_8_ != (pointer)(local_3098 + 0x10)) {
          operator_delete((void *)local_3098._0_8_,(ulong)(local_3098._16_8_ + 1));
        }
        if ((pointer)local_2038._0_8_ != (pointer)(local_2038 + 0x10)) {
          operator_delete((void *)local_2038._0_8_,(ulong)(local_2038._16_8_ + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_30b0);
        if ((local_1038._8_8_ == 0) || (local_1010._M_allocated_capacity == 0)) goto LAB_0015b6c4;
        std::__cxx11::string::_M_assign((string *)psVar1);
        std::__cxx11::string::_M_assign((string *)&model->hf_file);
        if (local_ff0[0]._M_allocated_capacity != 0) {
          local_3140->found_mmproj = true;
          std::__cxx11::string::_M_assign((string *)&(local_3140->mmproj).hf_repo);
          std::__cxx11::string::_M_assign((string *)&(local_3140->mmproj).hf_file);
        }
        if (local_ff8 != local_ff0[0]._M_local_buf + 8) {
          operator_delete(local_ff8,local_ff0[0]._8_8_ + 1);
        }
        if (local_1018 != local_1010._M_local_buf + 8) {
          operator_delete(local_1018,local_1010._8_8_ + 1);
        }
        if ((handle_model_result *)local_1038._0_8_ != (handle_model_result *)(local_1038 + 0x10)) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&model->hf_file);
      }
    }
    get_model_endpoint_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2868,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1038,
                   psVar1);
    plVar10 = (long *)std::__cxx11::string::append(local_2868);
    pbVar25 = (pointer)(local_3098 + 0x10);
    pbVar22 = (pointer)(plVar10 + 2);
    if ((pointer)*plVar10 == pbVar22) {
      local_3098._16_8_ = (pbVar22->_M_dataplus)._M_p;
      local_3098._24_8_ = plVar10[3];
      local_3098._0_8_ = pbVar25;
    }
    else {
      local_3098._16_8_ = (pbVar22->_M_dataplus)._M_p;
      local_3098._0_8_ = (pointer)*plVar10;
    }
    local_3098._8_8_ = plVar10[1];
    *plVar10 = (long)pbVar22;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append(local_3098,(ulong)(model->hf_file)._M_dataplus._M_p);
    pbVar22 = (pointer)(local_2038 + 0x10);
    pbVar23 = (pointer)(puVar11 + 2);
    if ((pointer)*puVar11 == pbVar23) {
      local_2038._16_8_ = (pbVar23->_M_dataplus)._M_p;
      local_2038._24_8_ = puVar11[3];
      local_2038._0_8_ = pbVar22;
    }
    else {
      local_2038._16_8_ = (pbVar23->_M_dataplus)._M_p;
      local_2038._0_8_ = (pointer)*puVar11;
    }
    local_2038._8_8_ = puVar11[1];
    *puVar11 = pbVar23;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&model->url,(string *)local_2038);
    if ((pointer)local_2038._0_8_ != pbVar22) {
      operator_delete((void *)local_2038._0_8_,(ulong)(local_2038._16_8_ + 1));
    }
    if ((pointer)local_3098._0_8_ != pbVar25) {
      operator_delete((void *)local_3098._0_8_,(ulong)(local_3098._16_8_ + 1));
    }
    pbVar23 = (pointer)(local_2868 + 0x10);
    if ((pointer)local_2868._0_8_ != pbVar23) {
      operator_delete((void *)local_2868._0_8_,(ulong)(local_2868._16_8_ + 1));
    }
    if ((model->path)._M_string_length == 0) {
      pcVar2 = (model->hf_repo)._M_dataplus._M_p;
      local_3098._0_8_ = pbVar25;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3098,pcVar2,pcVar2 + (model->hf_repo)._M_string_length);
      std::__cxx11::string::append(local_3098);
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append(local_3098,(ulong)(model->hf_file)._M_dataplus._M_p)
      ;
      pbVar24 = (pointer)(puVar11 + 2);
      if ((pointer)*puVar11 == pbVar24) {
        local_2038._16_8_ = (pbVar24->_M_dataplus)._M_p;
        local_2038._24_8_ = puVar11[3];
        local_2038._0_8_ = pbVar22;
      }
      else {
        local_2038._16_8_ = (pbVar24->_M_dataplus)._M_p;
        local_2038._0_8_ = (pointer)*puVar11;
      }
      local_2038._8_8_ = puVar11[1];
      *puVar11 = pbVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      if ((pointer)local_3098._0_8_ != pbVar25) {
        operator_delete((void *)local_3098._0_8_,(ulong)(local_3098._16_8_ + 1));
      }
      local_3098._0_8_ = pbVar25;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3098,"/","");
      local_2868._0_8_ = pbVar23;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2868,"_","");
      string_replace_all((string *)local_2038,(string *)local_3098,(string *)local_2868);
      if ((pointer)local_2868._0_8_ != pbVar23) {
        operator_delete((void *)local_2868._0_8_,(ulong)(local_2868._16_8_ + 1));
      }
      if ((pointer)local_3098._0_8_ != pbVar25) {
        operator_delete((void *)local_3098._0_8_,(ulong)(local_3098._16_8_ + 1));
      }
      fs_get_cache_file((string *)local_3098,(string *)local_2038);
      std::__cxx11::string::operator=((string *)model,(string *)local_3098);
      if ((pointer)local_3098._0_8_ != pbVar25) {
        operator_delete((void *)local_3098._0_8_,(ulong)(local_3098._16_8_ + 1));
      }
      if ((pointer)local_2038._0_8_ != pbVar22) {
        operator_delete((void *)local_2038._0_8_,(ulong)(local_2038._16_8_ + 1));
      }
    }
    phVar14 = (handle_model_result *)(local_1038 + 0x10);
    if ((handle_model_result *)local_1038._0_8_ != phVar14) {
LAB_0015b0f3:
      operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
      phVar14 = extraout_RAX_00;
    }
  }
  if ((model->url)._M_string_length == 0) {
    return phVar14;
  }
  psVar1 = &model->url;
  bVar6 = common_download_file_single(psVar1,&model->path,(string *)local_3180._16_8_);
  if (bVar6) {
    lVar12 = gguf_init_from_file((model->path)._M_dataplus._M_p,1,0);
    if (lVar12 == 0) {
      if (common_log_verbosity_thold < 0) goto LAB_0015b6c4;
      pcVar17 = common_log_main();
      common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,"\n%s:  failed to load input GGUF from %s\n",
                     "common_download_model",(model->path)._M_dataplus._M_p);
    }
    else {
      lVar13 = gguf_find_key(lVar12,"split.count");
      if (lVar13 < 0) {
        phVar14 = (handle_model_result *)gguf_free(lVar12);
        return phVar14;
      }
      uVar7 = gguf_get_val_u16(lVar12);
      phVar14 = (handle_model_result *)gguf_free(lVar12);
      if (uVar7 < 2) {
        return phVar14;
      }
      uVar26 = (uint)uVar7;
      memset(local_1038,0,0x1000);
      memset(local_3098,0,0x824);
      iVar8 = llama_split_prefix(local_1038,0x1000,(model->path)._M_dataplus._M_p,0,uVar26);
      if (iVar8 == 0) {
        if (-1 < common_log_verbosity_thold) {
          fmt = "\n%s: unexpected model file name: %s n_split=%d\n";
          local_31e0 = model;
          goto LAB_0015b670;
        }
      }
      else {
        iVar8 = llama_split_prefix(local_3098,0x824,(psVar1->_M_dataplus)._M_p,0,uVar26);
        if (iVar8 != 0) {
          local_3168._0_8_ =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
          local_3168._8_8_ =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
          local_3168._16_8_ = (pointer)0x0;
          uVar27 = 1;
          do {
            memset((char (*) [4096])local_2038,0,0x1000);
            llama_split_path((char (*) [4096])local_2038,0x1000,local_1038,uVar27,uVar26);
            memset((char (*) [2084])local_2868,0,0x824);
            llama_split_path((char (*) [2084])local_2868,0x824,local_3098,uVar27,uVar26);
            local_3138.first._M_dataplus._M_p = (pointer)&local_3138.first.field_2;
            sVar15 = strlen((char *)local_2038);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3138,(char (*) [4096])local_2038,local_2038 + sVar15);
            _Var4._M_p = local_3138.first._M_dataplus._M_p;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3138.first._M_string_length ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(model->path)._M_string_length) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3138.first._M_string_length
                  == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                bVar6 = true;
              }
              else {
                iVar8 = bcmp(local_3138.first._M_dataplus._M_p,(model->path)._M_dataplus._M_p,
                             local_3138.first._M_string_length);
                bVar6 = iVar8 == 0;
              }
            }
            else {
              bVar6 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var4._M_p != &local_3138.first.field_2) {
              operator_delete(_Var4._M_p,local_3138.first.field_2._M_allocated_capacity + 1);
            }
            if (!bVar6) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<char_(&)[2084],_char_(&)[4096],_true>
                        (&local_3138,(char (*) [2084])local_2868,(char (*) [4096])local_2038);
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)local_3168,&local_3138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3138.second._M_dataplus._M_p != &local_3138.second.field_2) {
                operator_delete(local_3138.second._M_dataplus._M_p,
                                local_3138.second.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3138.first._M_dataplus._M_p != &local_3138.first.field_2) {
                operator_delete(local_3138.first._M_dataplus._M_p,
                                local_3138.first.field_2._M_allocated_capacity + 1);
              }
            }
            uVar3 = local_3168._8_8_;
            uVar27 = uVar27 + 1;
          } while (uVar26 != uVar27);
          local_2868._0_8_ = (pointer)0x0;
          local_2868._8_8_ = (pointer)0x0;
          local_2868._16_8_ = (pointer)0x0;
          if (local_3168._0_8_ != local_3168._8_8_) {
            ppVar28 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_3168._0_8_;
            do {
              pcVar2 = ((_Alloc_hider *)local_3180._16_8_)->_M_p;
              local_2038._0_8_ = (pointer)(local_2038 + 0x10);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2038,pcVar2,pcVar2 + *(size_type *)(local_3180._16_8_ + 8))
              ;
              local_3138.first._M_dataplus._M_p = (pointer)0x0;
              local_3138.first._M_string_length = 0;
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa8);
              p_Var16->_M_use_count = 1;
              p_Var16->_M_weak_count = 1;
              p_Var16->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00262b58
              ;
              p_Var16[1]._M_use_count = 0;
              p_Var16[1]._M_weak_count = 0;
              *(undefined4 *)&p_Var16[2]._vptr__Sp_counted_base = 0;
              *(undefined1 *)((long)&p_Var16[2]._vptr__Sp_counted_base + 4) = 0;
              p_Var16[2]._M_use_count = 0;
              p_Var16[3]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var16[3]._M_use_count = 0;
              p_Var16[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00262ba8;
              this = (_Result<bool> *)operator_new(0x18);
              std::__future_base::_Result<bool>::_Result(this);
              p_Var16[4]._vptr__Sp_counted_base = (_func_int **)this;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&p_Var16[4]._M_use_count,ppVar28);
              *(_Atomic_word **)&p_Var16[8]._M_use_count = &p_Var16[9]._M_use_count;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&p_Var16[8]._M_use_count,local_2038._0_8_,
                         (pointer)(local_2038._0_8_ + (long)(_Alloc_hider *)local_2038._8_8_));
              local_31d8._M_dataplus._M_p = (pointer)0x0;
              local_31b0._M_dataplus._M_p = (pointer)operator_new(0x20);
              *(undefined ***)local_31b0._M_dataplus._M_p = &PTR___State_00262c00;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)local_31b0._M_dataplus._M_p + 8) = p_Var16 + 1;
              *(code **)((long)local_31b0._M_dataplus._M_p + 0x10) =
                   std::__future_base::
                   _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/arg.cpp:441:67),_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
                   ::_M_run;
              *(size_type *)((long)local_31b0._M_dataplus._M_p + 0x18) = 0;
              std::thread::_M_start_thread(&local_31d8,&local_31b0,0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_31b0._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_31b0._M_dataplus._M_p + 8))();
              }
              if (p_Var16[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
                std::terminate();
              }
              p_Var16[3]._vptr__Sp_counted_base = (_func_int **)local_31d8._M_dataplus._M_p;
              local_3138.first._M_dataplus._M_p = (pointer)(p_Var16 + 1);
              local_3138.first._M_string_length = (size_type)p_Var16;
              std::__basic_future<bool>::__basic_future(&local_3190,(__state_type *)&local_3138);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3138.first._M_string_length
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_3138.first._M_string_length);
              }
              std::vector<std::future<bool>,std::allocator<std::future<bool>>>::
              emplace_back<std::future<bool>>
                        ((vector<std::future<bool>,std::allocator<std::future<bool>>> *)local_2868,
                         (future<bool> *)&local_3190);
              if (local_3190._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_3190._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if ((pointer)local_2038._0_8_ != (pointer)(local_2038 + 0x10)) {
                operator_delete((void *)local_2038._0_8_,(ulong)(local_2038._16_8_ + 1));
              }
              uVar5 = local_2868._8_8_;
              ppVar28 = ppVar28 + 1;
            } while (ppVar28 !=
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)uVar3);
            pbVar25 = (pointer)local_2868._0_8_;
            if (local_2868._0_8_ != local_2868._8_8_) {
              do {
                bVar6 = std::future<bool>::get((future<bool> *)pbVar25);
                pbVar25 = (pointer)&pbVar25->field_2;
              } while (bVar6 && pbVar25 != (pointer)uVar5);
            }
          }
          std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector
                    ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)local_2868);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_3168);
          return extraout_RAX_01;
        }
        if (-1 < common_log_verbosity_thold) {
          fmt = "\n%s: unexpected model url: %s n_split=%d\n";
          local_31e0 = (common_params_model *)psVar1;
LAB_0015b670:
          pcVar17 = common_log_main();
          common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,fmt,"common_download_model",
                         (local_31e0->path)._M_dataplus._M_p,(ulong)uVar26);
        }
      }
    }
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar17 = common_log_main();
    common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,"error: failed to download model from %s\n",
                   (psVar1->_M_dataplus)._M_p);
  }
LAB_0015b6c4:
  exit(1);
}

Assistant:

static handle_model_result common_params_handle_model(
        struct common_params_model & model,
        const std::string & bearer_token,
        const std::string & model_path_default) {
    handle_model_result result;
    // handle pre-fill default model path and url based on hf_repo and hf_file
    {
        if (!model.hf_repo.empty()) {
            // short-hand to avoid specifying --hf-file -> default it to --model
            if (model.hf_file.empty()) {
                if (model.path.empty()) {
                    auto auto_detected = common_get_hf_file(model.hf_repo, bearer_token);
                    if (auto_detected.repo.empty() || auto_detected.ggufFile.empty()) {
                        exit(1); // built without CURL, error message already printed
                    }
                    model.hf_repo = auto_detected.repo;
                    model.hf_file = auto_detected.ggufFile;
                    if (!auto_detected.mmprojFile.empty()) {
                        result.found_mmproj   = true;
                        result.mmproj.hf_repo = model.hf_repo;
                        result.mmproj.hf_file = auto_detected.mmprojFile;
                    }
                } else {
                    model.hf_file = model.path;
                }
            }

            std::string model_endpoint = get_model_endpoint();
            model.url = model_endpoint + model.hf_repo + "/resolve/main/" + model.hf_file;
            // make sure model path is present (for caching purposes)
            if (model.path.empty()) {
                // this is to avoid different repo having same file name, or same file name in different subdirs
                std::string filename = model.hf_repo + "_" + model.hf_file;
                // to make sure we don't have any slashes in the filename
                string_replace_all(filename, "/", "_");
                model.path = fs_get_cache_file(filename);
            }

        } else if (!model.url.empty()) {
            if (model.path.empty()) {
                auto f = string_split<std::string>(model.url, '#').front();
                f = string_split<std::string>(f, '?').front();
                model.path = fs_get_cache_file(string_split<std::string>(f, '/').back());
            }

        } else if (model.path.empty()) {
            model.path = model_path_default;
        }
    }

    // then, download it if needed
    if (!model.url.empty()) {
        bool ok = common_download_model(model, bearer_token);
        if (!ok) {
            LOG_ERR("error: failed to download model from %s\n", model.url.c_str());
            exit(1);
        }
    }

    return result;
}